

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

number_validator<float> __thiscall goodform::sub_form::float32(sub_form *this)

{
  bool bVar1;
  undefined8 *in_RSI;
  undefined8 extraout_XMM0_Qa;
  number_validator<float> nVar2;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  float local_1c [2];
  float val;
  sub_form *this_local;
  
  this_local = this;
  bVar1 = convert<float>((any *)in_RSI[1],local_1c);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"NOT A float32",&local_61);
    error_message::error_message(&local_40,&local_60);
    error_message::operator=((error_message *)*in_RSI,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  number_validator<float>::number_validator
            ((number_validator<float> *)this,local_1c[0],(error_message *)*in_RSI);
  nVar2._8_8_ = extraout_XMM0_Qa;
  nVar2.error_ = (error_message *)this;
  return nVar2;
}

Assistant:

number_validator<float> sub_form::float32()
  {
    float val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A float32");
    return number_validator<float>(val, this->error_);
  }